

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

string * __thiscall
phosg::string_vprintf_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,char *fmt,__va_list_tag *va)

{
  char *__s;
  bad_alloc *this_00;
  size_type __n;
  allocator<char> local_2e;
  undefined1 local_2d;
  int local_2c;
  char *pcStack_28;
  int length;
  char *result;
  __va_list_tag *va_local;
  char *fmt_local;
  string *ret;
  
  pcStack_28 = (char *)0x0;
  result = fmt;
  va_local = (__va_list_tag *)this;
  fmt_local = (char *)__return_storage_ptr__;
  local_2c = vasprintf(&stack0xffffffffffffffd8,(char *)this,fmt);
  __s = pcStack_28;
  if (pcStack_28 != (char *)0x0) {
    local_2d = 0;
    __n = (size_type)local_2c;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,__s,__n,&local_2e);
    ::std::allocator<char>::~allocator(&local_2e);
    free(pcStack_28);
    return __return_storage_ptr__;
  }
  this_00 = (bad_alloc *)__cxa_allocate_exception(8);
  ::std::bad_alloc::bad_alloc(this_00);
  __cxa_throw(this_00,&::std::bad_alloc::typeinfo,::std::bad_alloc::~bad_alloc);
}

Assistant:

string string_vprintf(const char* fmt, va_list va) {
#ifndef PHOSG_WINDOWS
  char* result = nullptr;
  int length = vasprintf(&result, fmt, va);

  if (result == nullptr) {
    throw bad_alloc();
  }

  string ret(result, length);
  free(result);

#else
  string ret(0x400, '\0');
  int size = vsnprintf(ret.data(), ret.size(), fmt, va);
  // TODO: We probably can handle this case more gracefully. Really, we should
  // just restart va, resize the string, and call vsnprintf again, but I'm too
  // lazy to test/verify that this works (or that va doesn't need restarting)
  if (size > 0x400) {
    throw logic_error("size too long");
  }
  ret.resize(size);

#endif
  return ret;
}